

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

string * YAML::ErrorMsg::BAD_SUBSCRIPT_WITH_KEY(string *key)

{
  ostream *poVar1;
  string *in_RSI;
  string *in_RDI;
  stringstream stream;
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"operator[] call on a scalar");
  poVar1 = std::operator<<(poVar1," (key: \"");
  poVar1 = std::operator<<(poVar1,local_10);
  std::operator<<(poVar1,"\")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

inline const std::string BAD_SUBSCRIPT_WITH_KEY(const std::string& key) {
  std::stringstream stream;
  stream << BAD_SUBSCRIPT << " (key: \"" << key << "\")";
  return stream.str();
}